

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall opengv::absolute_pose::modules::Epnp::compute_pcs(Epnp *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  int i;
  long lVar7;
  int j;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  iVar4 = this->number_of_correspondences;
  pdVar5 = this->alphas;
  pdVar6 = this->pcs;
  for (lVar7 = 0; lVar7 < iVar4; lVar7 = lVar7 + 1) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pdVar5[lVar7 * 4];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = this->ccs[0][lVar8];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = pdVar5[lVar7 * 4 + 1] * this->ccs[1][lVar8];
      auVar1 = vfmadd231sd_fma(auVar11,auVar9,auVar1);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = pdVar5[lVar7 * 4 + 2];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->ccs[2][lVar8];
      auVar1 = vfmadd132sd_fma(auVar10,auVar1,auVar2);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = pdVar5[lVar7 * 4 + 3];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = this->ccs[3][lVar8];
      auVar1 = vfmadd132sd_fma(auVar12,auVar1,auVar3);
      pdVar6[lVar8] = auVar1._0_8_;
    }
    pdVar6 = pdVar6 + 3;
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::compute_pcs(void)
{
  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * a = alphas + 4 * i;
    double * pc = pcs + 3 * i;

    for(int j = 0; j < 3; j++)
      pc[j] =
          a[0] * ccs[0][j] +
          a[1] * ccs[1][j] +
          a[2] * ccs[2][j] +
          a[3] * ccs[3][j];
  }
}